

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_data_stored(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  undefined8 uVar2;
  ulong local_40;
  ssize_t bytes_avail;
  rar *rar;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  rar = (rar *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if ((*(long *)(bytes_avail + 0xa8) == 0) &&
     (((*(uint *)bytes_avail & 1) == 0 || ((*(uint *)(bytes_avail + 0x18) & 2) == 0)))) {
    *buff = (void *)0x0;
    *size = 0;
    *offset = *(int64_t *)(bytes_avail + 0xb8);
    if (*(long *)(bytes_avail + 8) == *(long *)(bytes_avail + 0xf0)) {
      *(undefined1 *)(bytes_avail + 0xed) = 1;
      a_local._4_4_ = 1;
    }
    else {
      archive_set_error(&a->archive,0x54,"File CRC error");
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    pvVar1 = rar_read_ahead(a,1,(ssize_t *)&local_40);
    *size_local = (size_t)pvVar1;
    if ((long)local_40 < 1) {
      archive_set_error((archive *)buff_local,0x54,"Truncated RAR file data");
      a_local._4_4_ = -0x1e;
    }
    else {
      *offset_local = local_40;
      *(undefined8 *)rar = *(undefined8 *)(bytes_avail + 0xb8);
      *(ulong *)(bytes_avail + 0xb8) = local_40 + *(long *)(bytes_avail + 0xb8);
      *(ulong *)(bytes_avail + 200) = local_40 + *(long *)(bytes_avail + 200);
      *(ulong *)(bytes_avail + 0xa8) = *(long *)(bytes_avail + 0xa8) - local_40;
      *(ulong *)(bytes_avail + 0xa0) = local_40;
      uVar2 = crc32(*(undefined8 *)(bytes_avail + 0xf0),*size_local,local_40 & 0xffffffff);
      *(undefined8 *)(bytes_avail + 0xf0) = uVar2;
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_data_stored(struct archive_read *a, const void **buff, size_t *size,
                 int64_t *offset)
{
  struct rar *rar;
  ssize_t bytes_avail;

  rar = (struct rar *)(a->format->data);
  if (rar->bytes_remaining == 0 &&
    !(rar->main_flags & MHD_VOLUME && rar->file_flags & FHD_SPLIT_AFTER))
  {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "File CRC error");
      return (ARCHIVE_FATAL);
#endif
    }
    rar->entry_eof = 1;
    return (ARCHIVE_EOF);
  }

  *buff = rar_read_ahead(a, 1, &bytes_avail);
  if (bytes_avail <= 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    return (ARCHIVE_FATAL);
  }

  *size = bytes_avail;
  *offset = rar->offset;
  rar->offset += bytes_avail;
  rar->offset_seek += bytes_avail;
  rar->bytes_remaining -= bytes_avail;
  rar->bytes_unconsumed = bytes_avail;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff,
    (unsigned)bytes_avail);
  return (ARCHIVE_OK);
}